

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O2

ErrCode __thiscall Regex::dumpTree(Regex *this,string *dump)

{
  Regex *pRVar1;
  Regex *pRVar2;
  ErrCode EVar3;
  Regex *this_00;
  bool bVar4;
  
  if (this->mState - STATE_PREPARED < 2) {
    EVar3 = kNoError;
    pRVar1 = (Regex *)&this->mRoot;
    while (this_00 = pRVar1, this_00 != (Regex *)0x0) {
      dumpElement(this_00,(Element *)this_00,dump);
      pRVar1 = (Regex *)(this_00->mRoot).mNext;
      if ((pRVar1 == (Regex *)0x0) &&
         (pRVar1 = (Regex *)(this_00->mRoot).mParent, pRVar1 == (Regex *)0x0)) {
        bVar4 = false;
        while (pRVar1 = this_00, !bVar4) {
          pRVar1 = *(Regex **)this_00;
          bVar4 = true;
          this_00 = (Regex *)0x0;
          if (pRVar1 != (Regex *)0x0) {
            pRVar2 = (Regex *)(pRVar1->mRoot).mParent;
            bVar4 = pRVar2 != (Regex *)0x0;
            this_00 = pRVar1;
            if (bVar4) {
              this_00 = pRVar2;
            }
          }
        }
      }
    }
  }
  else {
    EVar3 = kNotInitialized;
  }
  return EVar3;
}

Assistant:

JetHead::ErrCode	Regex::dumpTree( std::string &dump )
{
	if ( mState != Regex::STATE_PARSED && mState != Regex::STATE_PREPARED )
		return JetHead::kNotInitialized;

	Element *cur_node = &mRoot;
	
	while( cur_node != NULL )
	{
		dumpElement( cur_node, dump );
		
		if ( cur_node->mChild != NULL )
		{
			cur_node = cur_node->mChild;
		}
		else if ( cur_node->mNext != NULL )
		{
			cur_node = cur_node->mNext;
		}
		else 
		{
			bool done = false;
			while ( !done )
			{
				if ( cur_node->mParent == NULL )
				{
					done = true;
					cur_node = NULL;
				}
				else
				{
					cur_node = cur_node->mParent;
					if ( cur_node->mNext != NULL )
					{
						cur_node = cur_node->mNext;
						done = true;
					}
				}
			}
		}
	}
	
	return JetHead::kNoError;
}